

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cpp
# Opt level: O2

string * __thiscall
LiteScript::_Type_CALLBACK::ToString_abi_cxx11_
          (string *__return_storage_ptr__,_Type_CALLBACK *this,Variable *object)

{
  bool bVar1;
  Object *pOVar2;
  ostream *poVar3;
  char *pcVar4;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  pOVar2 = Variable::operator->(object);
  bVar1 = Callback::isInternal((Callback *)pOVar2->data);
  poVar3 = local_188;
  if (bVar1) {
    pcVar4 = "f(internal)";
  }
  else {
    poVar3 = std::operator<<(poVar3,"f(I=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,",L=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    pcVar4 = ")";
  }
  std::operator<<(poVar3,pcVar4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string LiteScript::_Type_CALLBACK::ToString(const Variable &object) const {
    std::stringstream ss;
    const Callback& C = object->GetData<Callback>();
    if (C.isInternal())
        ss << "f(internal)";
    else
        ss << "f(I=" << C.I << ",L=" << C.L << ")";
    return ss.str();
}